

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZGeoBlend<pzgeom::TPZGeoPyramid> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  long lVar1;
  
  TPZGeoPyramid::TPZGeoPyramid
            (&this->super_TPZGeoPyramid,&PTR_PTR_016c4148,&cp->super_TPZGeoPyramid,gl2lcNdMap);
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c40f0;
  lVar1 = 0x48;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1b0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x1a0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1860);
  std::operator<<((ostream *)&std::cout,"Please implement me\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }